

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverCrossSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverCrossSyntax,slang::syntax::CoverCrossSyntax_const&>
          (BumpAllocator *this,CoverCrossSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  CoverCrossSyntax *pCVar13;
  
  pCVar13 = (CoverCrossSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverCrossSyntax *)this->endPtr < pCVar13 + 1) {
    pCVar13 = (CoverCrossSyntax *)allocateSlow(this,0x110,8);
  }
  else {
    this->head->current = (byte *)(pCVar13 + 1);
  }
  (pCVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pCVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  TVar6 = (args->cross).kind;
  uVar7 = (args->cross).field_0x2;
  NVar8.raw = (args->cross).numFlags.raw;
  uVar9 = (args->cross).rawLen;
  pCVar13->label = args->label;
  (pCVar13->cross).kind = TVar6;
  (pCVar13->cross).field_0x2 = uVar7;
  (pCVar13->cross).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar13->cross).rawLen = uVar9;
  (pCVar13->cross).info = (args->cross).info;
  uVar5 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar13->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar13->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar13->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar13->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar13->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pCVar13->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  (pCVar13->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d5d58;
  sVar2 = (args->items).elements._M_extent._M_extent_value;
  (pCVar13->items).elements._M_ptr = (args->items).elements._M_ptr;
  (pCVar13->items).elements._M_extent._M_extent_value = sVar2;
  TVar6 = (args->openBrace).kind;
  uVar7 = (args->openBrace).field_0x2;
  NVar8.raw = (args->openBrace).numFlags.raw;
  uVar9 = (args->openBrace).rawLen;
  pCVar13->iff = args->iff;
  (pCVar13->openBrace).kind = TVar6;
  (pCVar13->openBrace).field_0x2 = uVar7;
  (pCVar13->openBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar13->openBrace).rawLen = uVar9;
  (pCVar13->openBrace).info = (args->openBrace).info;
  (pCVar13->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar13->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar13->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar13->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar13->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pCVar13->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar13->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar13->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar13->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d55d0;
  uVar7 = (args->closeBrace).field_0x2;
  NVar8.raw = (args->closeBrace).numFlags.raw;
  uVar9 = (args->closeBrace).rawLen;
  pIVar3 = (args->closeBrace).info;
  TVar6 = (args->emptySemi).kind;
  uVar10 = (args->emptySemi).field_0x2;
  NVar11.raw = (args->emptySemi).numFlags.raw;
  uVar12 = (args->emptySemi).rawLen;
  pIVar4 = (args->emptySemi).info;
  (pCVar13->closeBrace).kind = (args->closeBrace).kind;
  (pCVar13->closeBrace).field_0x2 = uVar7;
  (pCVar13->closeBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar13->closeBrace).rawLen = uVar9;
  (pCVar13->closeBrace).info = pIVar3;
  (pCVar13->emptySemi).kind = TVar6;
  (pCVar13->emptySemi).field_0x2 = uVar10;
  (pCVar13->emptySemi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar13->emptySemi).rawLen = uVar12;
  (pCVar13->emptySemi).info = pIVar4;
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }